

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_escape_sequence<toml::type_config>
            (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  char_type_conflict cVar1;
  error_info *__str;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  error_info *v_00;
  error_info *v_01;
  error_info *v_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  string *this;
  error_info *this_00;
  allocator<char> local_71a;
  allocator<char> local_719;
  sequence scanner;
  region reg;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  utf8;
  string escape_seqs;
  string_type retval;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  source_location local_470;
  source_location local_3f8;
  source_location local_380;
  source_location local_308;
  error_info local_290;
  error_info local_238;
  error_info local_1e0;
  error_info local_188;
  error_info local_130;
  error_info local_d8;
  error_info local_80;
  
  location::advance(loc,1);
  retval._M_dataplus._M_p = (pointer)&retval.field_2;
  retval._M_string_length = 0;
  retval.field_2._M_local_buf[0] = '\0';
  cVar1 = location::current(loc);
  cVar2 = '\\';
  if (cVar1 == '\\') {
LAB_002f193f:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval,cVar2);
    location::advance(loc,1);
    v = extraout_RDX;
  }
  else {
    cVar1 = location::current(loc);
    cVar2 = '\"';
    if (cVar1 == '\"') goto LAB_002f193f;
    cVar1 = location::current(loc);
    cVar2 = '\b';
    if (cVar1 == 'b') goto LAB_002f193f;
    cVar1 = location::current(loc);
    cVar2 = '\f';
    if (cVar1 == 'f') goto LAB_002f193f;
    cVar1 = location::current(loc);
    cVar2 = '\n';
    if (cVar1 == 'n') goto LAB_002f193f;
    cVar1 = location::current(loc);
    cVar2 = '\r';
    if (cVar1 == 'r') goto LAB_002f193f;
    cVar1 = location::current(loc);
    cVar2 = '\t';
    if (cVar1 == 't') goto LAB_002f193f;
    if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_e == true) {
      cVar1 = location::current(loc);
      cVar2 = '\x1b';
      if (cVar1 == 'e') goto LAB_002f193f;
    }
    if (((ctx->toml_spec_).v1_1_0_add_escape_sequence_x == true) &&
       (cVar1 = location::current(loc), cVar1 == 'x')) {
      escape_seqs._M_dataplus._M_p = (pointer)&PTR__scanner_base_00469940;
      escape_seqs._M_string_length._0_1_ = 0x78;
      syntax::hexdig::hexdig((hexdig *)&utf8,&ctx->toml_spec_);
      repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
                ((repeat_exact *)&reg,2,(hexdig *)&utf8);
      sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                (&scanner,(character *)&escape_seqs,(repeat_exact *)&reg);
      if (reg.source_name_._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)reg.source_name_._M_dataplus._M_p + 8))();
      }
      reg.source_name_._M_dataplus._M_p = (pointer)0x0;
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)&utf8.field_1.succ_.value._M_string_length);
      sequence::scan(&reg,&scanner,loc);
      if (reg.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        region::region((region *)&escape_seqs,loc);
        source_location::source_location((source_location *)&utf8,(region *)&escape_seqs);
        region::~region((region *)&escape_seqs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b0,
                   "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\xhh",
                   &local_719);
        source_location::source_location(&local_308,(source_location *)&utf8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"here",&local_71a);
        make_error_info<>((error_info *)&escape_seqs,&local_4b0,&local_308,&local_4d0);
        err<toml::error_info>((failure<toml::error_info> *)&local_80,(error_info *)&escape_seqs);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)&local_80);
        error_info::~error_info(&local_80);
        error_info::~error_info((error_info *)&escape_seqs);
        std::__cxx11::string::~string((string *)&local_4d0);
        source_location::~source_location(&local_308);
        this = &local_4b0;
LAB_002f2140:
        std::__cxx11::string::~string((string *)this);
        source_location::~source_location((source_location *)&utf8);
        region::~region(&reg);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&scanner.others_);
        goto LAB_002f198a;
      }
      parse_utf8_codepoint<toml::type_config>(&utf8,&reg);
      if (utf8.is_ok_ == false) {
        err<toml::error_info_const&>
                  ((failure<toml::error_info> *)&local_1e0,(toml *)&utf8.field_1.succ_,v_00);
        this_00 = &local_1e0;
LAB_002f2188:
        __str = this_00;
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)this_00);
        error_info::~error_info(this_00);
        cVar2 = utf8.is_ok_;
      }
      else {
        __str = (error_info *)
                result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                ::unwrap(&utf8,(source_location)0x46a088);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
        cVar2 = utf8.is_ok_;
      }
    }
    else {
      cVar1 = location::current(loc);
      if (cVar1 == 'u') {
        escape_seqs._M_dataplus._M_p = (pointer)&PTR__scanner_base_00469940;
        escape_seqs._M_string_length._0_1_ = 0x75;
        syntax::hexdig::hexdig((hexdig *)&utf8,&ctx->toml_spec_);
        repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
                  ((repeat_exact *)&reg,4,(hexdig *)&utf8);
        sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                  (&scanner,(character *)&escape_seqs,(repeat_exact *)&reg);
        if (reg.source_name_._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)reg.source_name_._M_dataplus._M_p + 8))();
        }
        reg.source_name_._M_dataplus._M_p = (pointer)0x0;
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 *)&utf8.field_1.succ_.value._M_string_length);
        sequence::scan(&reg,&scanner,loc);
        if (reg.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          region::region((region *)&escape_seqs,loc);
          source_location::source_location((source_location *)&utf8,(region *)&escape_seqs);
          region::~region((region *)&escape_seqs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f0,
                     "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\uhhhh",
                     &local_719);
          source_location::source_location(&local_380,(source_location *)&utf8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"here",&local_71a)
          ;
          make_error_info<>((error_info *)&escape_seqs,&local_4f0,&local_380,&local_510);
          err<toml::error_info>((failure<toml::error_info> *)&local_d8,(error_info *)&escape_seqs);
          result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
          ::result(__return_storage_ptr__,(failure_type *)&local_d8);
          error_info::~error_info(&local_d8);
          error_info::~error_info((error_info *)&escape_seqs);
          std::__cxx11::string::~string((string *)&local_510);
          source_location::~source_location(&local_380);
          this = &local_4f0;
          goto LAB_002f2140;
        }
        parse_utf8_codepoint<toml::type_config>(&utf8,&reg);
        if (utf8.is_ok_ == false) {
          err<toml::error_info_const&>
                    ((failure<toml::error_info> *)&local_238,(toml *)&utf8.field_1.succ_,v_01);
          this_00 = &local_238;
          goto LAB_002f2188;
        }
        __str = (error_info *)
                result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                ::unwrap(&utf8,(source_location)0x46a0a0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
        cVar2 = utf8.is_ok_;
      }
      else {
        cVar1 = location::current(loc);
        if (cVar1 != 'U') {
          region::region(&reg,loc);
          source_location::source_location((source_location *)&utf8,&reg);
          region::~region(&reg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&escape_seqs,
                     "allowed escape seqs: \\\\, \\\", \\b, \\f, \\n, \\r, \\t",
                     (allocator<char> *)&reg);
          if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_e == true) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&escape_seqs
                   ,", \\e");
          }
          if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_x == true) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&escape_seqs
                   ,", \\xhh");
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&escape_seqs,
                 ", \\uhhhh, or \\Uhhhhhhhh");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_570,"toml::parse_escape_sequence: unknown escape sequence.",
                     (allocator<char> *)&scanner);
          source_location::source_location(&local_470,(source_location *)&utf8);
          std::__cxx11::string::string
                    ((string *)&local_590,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &escape_seqs);
          make_error_info<>((error_info *)&reg,&local_570,&local_470,&local_590);
          err<toml::error_info>((failure<toml::error_info> *)&local_188,(error_info *)&reg);
          result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
          ::result(__return_storage_ptr__,(failure_type *)&local_188);
          error_info::~error_info(&local_188);
          error_info::~error_info((error_info *)&reg);
          std::__cxx11::string::~string((string *)&local_590);
          source_location::~source_location(&local_470);
          std::__cxx11::string::~string((string *)&local_570);
          std::__cxx11::string::~string((string *)&escape_seqs);
          source_location::~source_location((source_location *)&utf8);
          goto LAB_002f198a;
        }
        escape_seqs._M_dataplus._M_p = (pointer)&PTR__scanner_base_00469940;
        escape_seqs._M_string_length._0_1_ = 0x55;
        syntax::hexdig::hexdig((hexdig *)&utf8,&ctx->toml_spec_);
        repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
                  ((repeat_exact *)&reg,8,(hexdig *)&utf8);
        sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                  (&scanner,(character *)&escape_seqs,(repeat_exact *)&reg);
        if (reg.source_name_._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)reg.source_name_._M_dataplus._M_p + 8))();
        }
        reg.source_name_._M_dataplus._M_p = (pointer)0x0;
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 *)&utf8.field_1.succ_.value._M_string_length);
        sequence::scan(&reg,&scanner,loc);
        if (reg.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          region::region((region *)&escape_seqs,loc);
          source_location::source_location((source_location *)&utf8,(region *)&escape_seqs);
          region::~region((region *)&escape_seqs);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_530,
                     "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\Uhhhhhhhh"
                     ,&local_719);
          source_location::source_location(&local_3f8,(source_location *)&utf8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"here",&local_71a)
          ;
          make_error_info<>((error_info *)&escape_seqs,&local_530,&local_3f8,&local_550);
          err<toml::error_info>((failure<toml::error_info> *)&local_130,(error_info *)&escape_seqs);
          result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
          ::result(__return_storage_ptr__,(failure_type *)&local_130);
          error_info::~error_info(&local_130);
          error_info::~error_info((error_info *)&escape_seqs);
          std::__cxx11::string::~string((string *)&local_550);
          source_location::~source_location(&local_3f8);
          this = &local_530;
          goto LAB_002f2140;
        }
        parse_utf8_codepoint<toml::type_config>(&utf8,&reg);
        if (utf8.is_ok_ == false) {
          err<toml::error_info_const&>
                    ((failure<toml::error_info> *)&local_290,(toml *)&utf8.field_1.succ_,v_02);
          this_00 = &local_290;
          goto LAB_002f2188;
        }
        __str = (error_info *)
                result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                ::unwrap(&utf8,(source_location)0x46a0b8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
        cVar2 = utf8.is_ok_;
      }
    }
    result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
    ::cleanup(&utf8,(EVP_PKEY_CTX *)__str);
    region::~region(&reg);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&scanner.others_);
    v = extraout_RDX_00;
    if (cVar2 == '\0') goto LAB_002f198a;
  }
  ok<std::__cxx11::string&>(&local_490,(toml *)&retval,v);
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  ::result(__return_storage_ptr__,(success_type *)&local_490);
  std::__cxx11::string::~string((string *)&local_490);
LAB_002f198a:
  std::__cxx11::string::~string((string *)&retval);
  return __return_storage_ptr__;
}

Assistant:

result<typename basic_value<TC>::string_type, error_info>
parse_escape_sequence(location& loc, const context<TC>& ctx)
{
    using string_type = typename basic_value<TC>::string_type;
    using char_type = typename string_type::value_type;

    const auto& spec = ctx.toml_spec();

    assert( ! loc.eof());
    assert(loc.current() == '\\');
    loc.advance(); // consume the first backslash

    string_type retval;

    if     (loc.current() == '\\') { retval += char_type('\\'); loc.advance(); }
    else if(loc.current() == '"')  { retval += char_type('\"'); loc.advance(); }
    else if(loc.current() == 'b')  { retval += char_type('\b'); loc.advance(); }
    else if(loc.current() == 'f')  { retval += char_type('\f'); loc.advance(); }
    else if(loc.current() == 'n')  { retval += char_type('\n'); loc.advance(); }
    else if(loc.current() == 'r')  { retval += char_type('\r'); loc.advance(); }
    else if(loc.current() == 't')  { retval += char_type('\t'); loc.advance(); }
    else if(spec.v1_1_0_add_escape_sequence_e && loc.current() == 'e')
    {
        retval += char_type('\x1b');
        loc.advance();
    }
    else if(spec.v1_1_0_add_escape_sequence_x && loc.current() == 'x')
    {
        auto scanner = sequence(character('x'), repeat_exact(2, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\xhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else if(loc.current() == 'u')
    {
        auto scanner = sequence(character('u'), repeat_exact(4, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\uhhhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else if(loc.current() == 'U')
    {
        auto scanner = sequence(character('U'), repeat_exact(8, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\Uhhhhhhhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else
    {
        auto src = source_location(region(loc));
        std::string escape_seqs = "allowed escape seqs: \\\\, \\\", \\b, \\f, \\n, \\r, \\t";
        if(spec.v1_1_0_add_escape_sequence_e)
        {
            escape_seqs += ", \\e";
        }
        if(spec.v1_1_0_add_escape_sequence_x)
        {
            escape_seqs += ", \\xhh";
        }
        escape_seqs += ", \\uhhhh, or \\Uhhhhhhhh";

        return err(make_error_info("toml::parse_escape_sequence: "
               "unknown escape sequence.", std::move(src), escape_seqs));
    }
    return ok(retval);
}